

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_process.cc
# Opt level: O0

void flyd::flyd_worker_process_init(int inum)

{
  SourceFile file;
  SourceFile file_00;
  bool bVar1;
  int iVar2;
  sigset_t set;
  undefined8 in_stack_ffffffffffffdf88;
  Logger *this;
  Logger *in_stack_ffffffffffffdf90;
  char (*in_stack_ffffffffffffdf98) [102];
  SourceFile *in_stack_ffffffffffffdfa0;
  Logger *in_stack_ffffffffffffdfc0;
  int in_stack_ffffffffffffe05c;
  ThreadPool *in_stack_ffffffffffffe060;
  Logger local_1060;
  CSocekt *in_stack_ffffffffffffffc0;
  CSocekt *in_stack_ffffffffffffffd8;
  
  sigemptyset((sigset_t *)&stack0xffffffffffffff78);
  iVar2 = sigprocmask(2,(sigset_t *)&stack0xffffffffffffff78,(sigset_t *)0x0);
  if (iVar2 == -1) {
    muduo::Logger::SourceFile::SourceFile<102>(in_stack_ffffffffffffdfa0,in_stack_ffffffffffffdf98);
    in_stack_ffffffffffffdf90 = &local_1060;
    file._8_8_ = in_stack_ffffffffffffdfa0;
    file.data_ = *in_stack_ffffffffffffdf98;
    muduo::Logger::Logger
              (in_stack_ffffffffffffdf90,file,(int)((ulong)in_stack_ffffffffffffdf88 >> 0x20),
               (LogLevel)in_stack_ffffffffffffdf88);
    muduo::Logger::stream(in_stack_ffffffffffffdf90);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdfa0,*in_stack_ffffffffffffdf98);
    muduo::Logger::~Logger(in_stack_ffffffffffffdfc0);
  }
  muduo::ThreadPool::start(in_stack_ffffffffffffe060,in_stack_ffffffffffffe05c);
  bVar1 = CSocekt::Initialize_subproc(in_stack_ffffffffffffffd8);
  if (!bVar1) {
    muduo::Logger::SourceFile::SourceFile<102>(in_stack_ffffffffffffdfa0,in_stack_ffffffffffffdf98);
    this = (Logger *)&stack0xffffffffffffdfa8;
    file_00._8_8_ = in_stack_ffffffffffffdfa0;
    file_00.data_ = *in_stack_ffffffffffffdf98;
    muduo::Logger::Logger
              (in_stack_ffffffffffffdf90,file_00,(int)((ulong)this >> 0x20),(LogLevel)this);
    muduo::Logger::stream(this);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffdfa0,*in_stack_ffffffffffffdf98);
    muduo::Logger::~Logger(in_stack_ffffffffffffdfc0);
  }
  CSocekt::flyd_epoll_init(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void flyd_worker_process_init(int inum) {

        sigset_t set;      //信号集

        sigemptyset(&set);  //清空信号集
        if (sigprocmask(SIG_SETMASK, &set, NULL) == -1)  //原来是屏蔽那10个信号【防止fork()期间收到信号导致混乱】，现在不再屏蔽任何信号【接收任何信号】
        {
            LOG_ERROR << "ngx_worker_process_init()中sigprocmask()失败!";
        }

        //线程池代码，率先创建，至少要比和socket相关的内容优先
        g_threadpool.start(5);

        if(g_socket.Initialize_subproc() == false) //初始化子进程需要具备的一些多线程能力相关的问题
        {
            LOG_FATAL << "子进程初始化失败";
        }

        g_socket.flyd_epoll_init();
    }